

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

int weapon_type(obj *obj)

{
  int local_20;
  int type;
  obj *obj_local;
  
  if (obj == (obj *)0x0) {
    obj_local._4_4_ = 0x25;
  }
  else if ((obj->otyp == 0x216) && (urole.malenum == 0x15d)) {
    obj_local._4_4_ = (int)objects[obj->otyp].oc_subtyp;
  }
  else if ((obj->oclass == '\x02') || ((obj->oclass == '\x06' || (obj->oclass == '\r')))) {
    local_20 = (int)objects[obj->otyp].oc_subtyp;
    if (local_20 < 0) {
      local_20 = -local_20;
    }
    obj_local._4_4_ = local_20;
  }
  else {
    obj_local._4_4_ = 0;
  }
  return obj_local._4_4_;
}

Assistant:

int weapon_type(const struct obj *obj)
{
	/* KMH -- now uses the object table */
	int type;

	if (!obj)
		/* Not using a weapon */
		return P_BARE_HANDED_COMBAT;
	if (obj->otyp == HEAVY_IRON_BALL && Role_if(PM_CONVICT))
		return objects[obj->otyp].oc_skill;
	if (obj->oclass != WEAPON_CLASS && obj->oclass != TOOL_CLASS &&
	    obj->oclass != GEM_CLASS)
		/* Not a weapon, weapon-tool, or ammo */
		return P_NONE;
	type = objects[obj->otyp].oc_skill;
	return (type < 0) ? -type : type;
}